

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.hpp
# Opt level: O1

void __thiscall
boost::xpressive::detail::
match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::match_state(match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    begin,
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             end,match_results *what,regex_impl *impl,match_flag_type flags)

{
  extras_type *peVar1;
  
  (this->cur_)._M_current = begin._M_current;
  this->sub_matches_ = (sub_match_impl *)0x0;
  this->mark_count_ = 0;
  (this->begin_)._M_current = begin._M_current;
  (this->end_)._M_current = end._M_current;
  match_flags::match_flags(&this->flags_,flags);
  this->found_partial_match_ = false;
  (this->context_).results_ptr_ =
       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  (this->context_).prev_context_ =
       (match_context<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  (this->context_).next_ptr_ =
       (matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  (this->context_).traits_ = (traits<char> *)0x0;
  peVar1 = match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_extras_(what);
  this->extras_ = peVar1;
  (this->action_list_)._vptr_actionable = (_func_int **)&PTR__actionable_00197d08;
  (this->action_list_).next = (actionable *)0x0;
  this->action_list_tail_ = &(this->action_list_).next;
  this->action_args_ = &what->args_;
  (this->attr_context_).attr_slots_ = (void **)0x0;
  (this->attr_context_).prev_attr_context_ = (attr_context *)0x0;
  (this->next_search_)._M_current = begin._M_current;
  sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unwind(&peVar1->sub_match_stack_);
  init_(this,impl,what);
  results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reclaim_all(&this->extras_->results_cache_,&what->nested_results_);
  return;
}

Assistant:

match_state
    (
        BidiIter begin
      , BidiIter end
      , match_results &what
      , regex_impl const &impl
      , regex_constants::match_flag_type flags
    )
      : cur_(begin)
      , sub_matches_(0)
      , mark_count_(0)
      , begin_(begin)
      , end_(end)
      , flags_(flags)
      , found_partial_match_(false)
      , context_() // zero-initializes the fields of context_
      , extras_(&core_access<BidiIter>::get_extras(what))
      , action_list_()
      , action_list_tail_(&action_list_.next)
      , action_args_(&core_access<BidiIter>::get_action_args(what))
      , attr_context_() // zero-initializes the fields of attr_context_
      , next_search_(begin)
    {
        // reclaim any cached memory in the match_results struct
        this->extras_->sub_match_stack_.unwind();

        // initialize the context_ struct
        this->init_(impl, what);

        // move all the nested match_results structs into the match_results cache
        this->extras_->results_cache_.reclaim_all(access::get_nested_results(what));
    }